

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O0

int Fra_OneHotRefineUsingCex(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  Aig_Man_t *pAVar1;
  Fra_Sml_t *pSeq;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Aig_Obj_t *pObj1_00;
  Aig_Obj_t *pObj2_00;
  int local_38;
  int nPiNum;
  int RetValue;
  int Out2;
  int Out1;
  int i;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj1;
  Vec_Int_t *vOneHots_local;
  Fra_Man_t *p_local;
  
  local_38 = 0;
  iVar2 = Aig_ManCiNum(p->pManAig);
  iVar3 = Aig_ManRegNum(p->pManAig);
  if (p->pSml->pAig != p->pManAig) {
    __assert_fail("p->pSml->pAig == p->pManAig",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraHot.c"
                  ,0x10f,"int Fra_OneHotRefineUsingCex(Fra_Man_t *, Vec_Int_t *)");
  }
  for (Out2 = 0; iVar4 = Vec_IntSize(vOneHots), Out2 < iVar4; Out2 = Out2 + 2) {
    iVar4 = Vec_IntEntry(vOneHots,Out2);
    iVar5 = Vec_IntEntry(vOneHots,Out2 + 1);
    if ((iVar4 != 0) || (iVar5 != 0)) {
      pAVar1 = p->pManAig;
      iVar6 = Fra_LitReg(iVar4);
      pObj1_00 = Aig_ManCi(pAVar1,(iVar2 - iVar3) + iVar6);
      pAVar1 = p->pManAig;
      iVar6 = Fra_LitReg(iVar5);
      pObj2_00 = Aig_ManCi(pAVar1,(iVar2 - iVar3) + iVar6);
      pSeq = p->pSml;
      iVar4 = Fra_LitSign(iVar4);
      iVar5 = Fra_LitSign(iVar5);
      iVar4 = Fra_OneHotNodesAreClause(pSeq,pObj1_00,pObj2_00,iVar4,iVar5);
      if (iVar4 == 0) {
        Vec_IntWriteEntry(vOneHots,Out2,0);
        Vec_IntWriteEntry(vOneHots,Out2 + 1,0);
        local_38 = 1;
      }
    }
  }
  return local_38;
}

Assistant:

int Fra_OneHotRefineUsingCex( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Obj_t * pObj1, * pObj2;
    int i, Out1, Out2, RetValue = 0;
    int nPiNum = Aig_ManCiNum(p->pManAig) - Aig_ManRegNum(p->pManAig);
    assert( p->pSml->pAig == p->pManAig );
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        // get the corresponding nodes
        pObj1 = Aig_ManCi( p->pManAig, nPiNum + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCi( p->pManAig, nPiNum + Fra_LitReg(Out2) );
        // check if implication holds using this simulation info
        if ( !Fra_OneHotNodesAreClause( p->pSml, pObj1, pObj2, Fra_LitSign(Out1), Fra_LitSign(Out2) ) )
        {
            Vec_IntWriteEntry( vOneHots, i, 0 );
            Vec_IntWriteEntry( vOneHots, i+1, 0 );
            RetValue = 1;
        }
    }
    return RetValue;
}